

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int point_to_cbb(CBB *out,EC_GROUP *group,EC_AFFINE *point)

{
  int iVar1;
  uint8_t *puVar2;
  bool local_39;
  uint8_t *local_38;
  uint8_t *p;
  size_t len;
  EC_AFFINE *point_local;
  EC_GROUP *group_local;
  CBB *out_local;
  
  len = (size_t)point;
  point_local = (EC_AFFINE *)group;
  group_local = (EC_GROUP *)out;
  p = (uint8_t *)ec_point_byte_len(group,POINT_CONVERSION_UNCOMPRESSED);
  if (p == (uint8_t *)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    iVar1 = CBB_add_space((CBB *)group_local,&local_38,(size_t)p);
    local_39 = false;
    if (iVar1 != 0) {
      puVar2 = (uint8_t *)
               ec_point_to_bytes((EC_GROUP *)point_local,(EC_AFFINE *)len,
                                 POINT_CONVERSION_UNCOMPRESSED,local_38,(size_t)p);
      local_39 = puVar2 == p;
    }
    out_local._4_4_ = (uint)local_39;
  }
  return out_local._4_4_;
}

Assistant:

static int point_to_cbb(CBB *out, const EC_GROUP *group,
                        const EC_AFFINE *point) {
  size_t len = ec_point_byte_len(group, POINT_CONVERSION_UNCOMPRESSED);
  if (len == 0) {
    return 0;
  }
  uint8_t *p;
  return CBB_add_space(out, &p, len) &&
         ec_point_to_bytes(group, point, POINT_CONVERSION_UNCOMPRESSED, p,
                           len) == len;
}